

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,REF_INT node)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  REF_CELL *ppRVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  REF_DBL volume;
  REF_GRID local_b0;
  REF_INT nodes [27];
  
  ppRVar4 = ref_grid->cell + 3;
  if (ref_grid->twod == 0) {
    ppRVar4 = ref_grid->cell + 8;
  }
  ref_cell = *ppRVar4;
  uVar8 = 0xffffffff;
  uVar6 = 0xffffffff;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar8 = 0xffffffff;
    uVar6 = 0xffffffff;
    if (node < pRVar1->nnode) {
      uVar3 = pRVar1->first[(uint)node];
      uVar8 = 0xffffffff;
      uVar6 = 0xffffffff;
      if ((long)(int)uVar3 != -1) {
        uVar6 = (ulong)(uint)pRVar1->item[(int)uVar3].ref;
        uVar8 = (ulong)uVar3;
      }
    }
  }
  ref_node = ref_grid->node;
  local_b0 = ref_grid;
  while( true ) {
    if ((int)uVar8 == -1) {
      return 0;
    }
    uVar3 = ref_cell_nodes(ref_cell,(REF_INT)uVar6,nodes);
    if (uVar3 != 0) break;
    if (local_b0->twod == 0) {
      uVar3 = ref_node_tet_vol(ref_node,nodes,&volume);
      if (uVar3 != 0) {
        uVar6 = (ulong)uVar3;
        pcVar7 = "vol";
        uVar5 = 0x1c1;
        goto LAB_00199fd1;
      }
    }
    else {
      uVar3 = ref_node_tri_area(ref_node,nodes,&volume);
      if (uVar3 != 0) {
        uVar6 = (ulong)uVar3;
        pcVar7 = "area";
        uVar5 = 0x1bf;
        goto LAB_00199fd1;
      }
    }
    if (volume <= 0.0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x1c8,"ref_validation_cell_volume_at_node","negative volume tet");
      printf("cell %d volume %e\n",volume,uVar6);
      for (lVar9 = 0; lVar9 < ref_cell->node_per; lVar9 = lVar9 + 1) {
        ref_node_location(ref_node,nodes[lVar9]);
      }
      return 1;
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar8 = (ulong)pRVar2[(int)uVar8].next;
    uVar6 = 0xffffffff;
    if (uVar8 != 0xffffffffffffffff) {
      uVar6 = (ulong)(uint)pRVar2[uVar8].ref;
    }
  }
  uVar6 = (ulong)uVar3;
  pcVar7 = "nodes";
  uVar5 = 0x1bd;
LAB_00199fd1:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
         uVar5,"ref_validation_cell_volume_at_node",uVar6,pcVar7);
  return (REF_STATUS)uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_volume_at_node(REF_GRID ref_grid,
                                                      REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_DBL volume;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    } else {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    }
    RAB(volume > 0.0, "negative volume tet", {
      REF_INT cell_node;
      printf("cell %d volume %e\n", cell, volume);
      each_ref_cell_cell_node(ref_cell, cell_node)
          ref_node_location(ref_node, nodes[cell_node]);
    });
  }

  return REF_SUCCESS;
}